

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_extract_i32_x86_64(TCGContext *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg,uint ofs,uint len)

{
  uint len_local;
  uint ofs_local;
  TCGv_i32 arg_local;
  TCGv_i32 ret_local;
  TCGContext *tcg_ctx_local;
  
  if (ofs + len == 0x20) {
    tcg_gen_shri_i32_x86_64(tcg_ctx,ret,arg,0x20 - len);
  }
  else if (ofs == 0) {
    tcg_gen_andi_i32_x86_64(tcg_ctx,ret,arg,(1 << ((byte)len & 0x1f)) + -1);
  }
  else if ((ofs == 8) && (len == 8)) {
    tcg_gen_op4ii_i32(tcg_ctx,INDEX_op_extract_i32,ret,arg,8,8);
  }
  else if (ofs + len == 8) {
    tcg_gen_ext8u_i32_x86_64(tcg_ctx,ret,arg);
    tcg_gen_shri_i32_x86_64(tcg_ctx,ret,ret,ofs);
  }
  else if (ofs + len == 0x10) {
    tcg_gen_ext16u_i32_x86_64(tcg_ctx,ret,arg);
    tcg_gen_shri_i32_x86_64(tcg_ctx,ret,ret,ofs);
  }
  else if ((len - 1 < 8) || (len == 0x10)) {
    tcg_gen_shri_i32_x86_64(tcg_ctx,ret,arg,ofs);
    tcg_gen_andi_i32_x86_64(tcg_ctx,ret,ret,(1 << ((byte)len & 0x1f)) + -1);
  }
  else {
    tcg_gen_shli_i32_x86_64(tcg_ctx,ret,arg,(0x20 - len) - ofs);
    tcg_gen_shri_i32_x86_64(tcg_ctx,ret,ret,0x20 - len);
  }
  return;
}

Assistant:

void tcg_gen_extract_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg,
                         unsigned int ofs, unsigned int len)
{
    tcg_debug_assert(ofs < 32);
    tcg_debug_assert(len > 0);
    tcg_debug_assert(len <= 32);
    tcg_debug_assert(ofs + len <= 32);

    /* Canonicalize certain special cases, even if extract is supported.  */
    if (ofs + len == 32) {
        tcg_gen_shri_i32(tcg_ctx, ret, arg, 32 - len);
        return;
    }
    if (ofs == 0) {
        tcg_gen_andi_i32(tcg_ctx, ret, arg, (1u << len) - 1);
        return;
    }

    if (TCG_TARGET_HAS_extract_i32
        && TCG_TARGET_extract_i32_valid(ofs, len)) {
        tcg_gen_op4ii_i32(tcg_ctx, INDEX_op_extract_i32, ret, arg, ofs, len);
        return;
    }

    /* Assume that zero-extension, if available, is cheaper than a shift.  */
    switch (ofs + len) {
    case 16:
        if (TCG_TARGET_HAS_ext16u_i32) {
            tcg_gen_ext16u_i32(tcg_ctx, ret, arg);
            tcg_gen_shri_i32(tcg_ctx, ret, ret, ofs);
            return;
        }
        break;
    case 8:
        if (TCG_TARGET_HAS_ext8u_i32) {
            tcg_gen_ext8u_i32(tcg_ctx, ret, arg);
            tcg_gen_shri_i32(tcg_ctx, ret, ret, ofs);
            return;
        }
        break;
    }

    /* ??? Ideally we'd know what values are available for immediate AND.
       Assume that 8 bits are available, plus the special case of 16,
       so that we get ext8u, ext16u.  */
    switch (len) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 16:
        tcg_gen_shri_i32(tcg_ctx, ret, arg, ofs);
        tcg_gen_andi_i32(tcg_ctx, ret, ret, (1u << len) - 1);
        break;
    default:
        tcg_gen_shli_i32(tcg_ctx, ret, arg, 32 - len - ofs);
        tcg_gen_shri_i32(tcg_ctx, ret, ret, 32 - len);
        break;
    }
}